

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O2

uint8_t * __thiscall
cdns_class_id::parse_map_item(cdns_class_id *this,uint8_t *in,uint8_t *in_max,int64_t val,int *err)

{
  uint8_t *puVar1;
  
  if (val == 1) {
    this = (cdns_class_id *)&this->rr_class;
  }
  else if (val != 0) {
    *err = -2;
    return (uint8_t *)0x0;
  }
  puVar1 = cbor_parse_int(in,in_max,&this->rr_type,0,err);
  return puVar1;
}

Assistant:

uint8_t* cdns_class_id::parse_map_item(uint8_t* in, uint8_t const * in_max, int64_t val, int* err)
{
    switch (val) {
    case 0:
        in = cbor_parse_int(in, in_max, &rr_type, 0, err);
        break;
    case 1:
        in = cbor_parse_int(in, in_max, &rr_class, 0, err);
        break;
    default:
        in = NULL;
        *err = CBOR_ILLEGAL_VALUE;
        break;
    }
    return in;
}